

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O0

void zzSqr(word *b,word *a,size_t n,void *stack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  ulong in_RDX;
  long in_RSI;
  word *in_RDI;
  size_t j;
  size_t i;
  dword prod;
  word carry1;
  word carry;
  ulong local_58;
  ulong local_50;
  ulong local_28;
  
  wwSetZero(in_RDI,in_RDX * 2);
  for (local_50 = 0; local_28 = 0, local_58 = local_50, local_50 < in_RDX; local_50 = local_50 + 1)
  {
    while (local_58 = local_58 + 1, local_58 < in_RDX) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)(in_RSI + local_50 * 8);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)(in_RSI + local_58 * 8);
      uVar5 = SUB168(auVar1 * auVar3,0);
      uVar6 = uVar5 + local_28;
      local_28 = SUB168(auVar1 * auVar3,8) + (ulong)CARRY8(uVar5,local_28) +
                 (ulong)CARRY8(uVar6,in_RDI[local_50 + local_58]);
      in_RDI[local_50 + local_58] = uVar6 + in_RDI[local_50 + local_58];
    }
    in_RDI[local_50 + local_58] = local_28;
  }
  for (local_50 = 0; local_50 < in_RDX * 2; local_50 = local_50 + 1) {
    uVar5 = in_RDI[local_50];
    in_RDI[local_50] = in_RDI[local_50] << 1 | local_28;
    local_28 = uVar5 >> 0x3f;
  }
  for (local_50 = 0; local_50 < in_RDX; local_50 = local_50 + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)(in_RSI + local_50 * 8);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)(in_RSI + local_50 * 8);
    uVar5 = SUB168(auVar2 * auVar4,0);
    uVar6 = uVar5 + local_28;
    uVar5 = SUB168(auVar2 * auVar4,8) + (ulong)CARRY8(uVar5,local_28) +
            (ulong)CARRY8(uVar6,in_RDI[local_50 * 2]);
    in_RDI[local_50 * 2] = uVar6 + in_RDI[local_50 * 2];
    local_28 = (ulong)CARRY8(uVar5,in_RDI[local_50 * 2 + 1]);
    in_RDI[local_50 * 2 + 1] = uVar5 + in_RDI[local_50 * 2 + 1];
  }
  return;
}

Assistant:

void zzSqr(word b[], const word a[], size_t n, void* stack)
{
	register word carry = 0;
	register word carry1;
	register dword prod;
	size_t i, j;
	ASSERT(wwIsDisjoint2(a, n, b, n + n));
	// b <- \sum_{i < j} a_i a_j B^{i + j}
	wwSetZero(b, n + n);
	for (i = 0; i < n; ++i)
	{
		for (j = i + 1; j < n; ++j)
		{
			zzMul11(prod, a[i], a[j]);
			prod += carry;
			prod += b[i + j];
			b[i + j] = (word)prod;
			carry = (word)(prod >> B_PER_W);
		}
		b[i + j] = carry;
		carry = 0;
	}
	// b <- 2 b
	for (i = 0; i < n + n; ++i)
	{
		carry1 = b[i] >> (B_PER_W - 1);
		b[i] = (b[i] << 1) | carry;
		carry = carry1;
	}
	// b <- b + \sum_i a_i^2 B^{i + i}
	for (i = 0; i < n; ++i)
	{
		zzMul11(prod, a[i], a[i]);
		prod += carry;
		prod += b[i + i];
		b[i + i] = (word)prod;
		prod >>= B_PER_W;
		prod += b[i + i + 1];
		b[i + i + 1] = (word)prod;
		carry = (word)(prod >> B_PER_W);
	}
	prod = 0;
	carry = carry1 = 0;
}